

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

bool IntToMinMaxCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  ulong uVar9;
  int32_t *dataptr;
  void *pvVar10;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t extraout_RDX_03;
  idx_t idx;
  idx_t extraout_RDX_04;
  idx_t extraout_RDX_05;
  idx_t i;
  idx_t iVar11;
  ulong uVar12;
  VectorType VVar13;
  TemplatedValidityMask<unsigned_long> *other;
  ulong uVar14;
  idx_t i_1;
  idx_t iVar15;
  int32_t *local_b8;
  int32_t *local_b0;
  TemplatedValidityMask<unsigned_long> *local_a8;
  void *local_a0;
  void *local_98;
  long local_90;
  long local_88;
  int32_t max_val;
  int32_t min_val;
  long *local_78;
  long local_70;
  long local_68;
  
  min_val = MinMaxType::GetMinValue((LogicalType *)(result + 8));
  max_val = MinMaxType::GetMaxValue((LogicalType *)(result + 8));
  dataptr = &max_val;
  VVar13 = (VectorType)result;
  local_b8 = &min_val;
  local_b0 = dataptr;
  if (*source == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar13);
    lVar6 = *(long *)(result + 0x20);
    lVar4 = *(long *)(source + 0x20);
    duckdb::FlatVector::VerifyFlatVector(source);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (*(long *)(source + 0x28) == 0) {
      iVar15 = extraout_RDX;
      for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
        iVar1 = *(int *)(lVar4 + iVar11 * 4);
        duckdb::UnaryLambdaWrapper::
        Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                  (iVar1,(ValidityMask *)&local_b8,iVar15,dataptr);
        *(int *)(lVar6 + iVar11 * 4) = iVar1;
        iVar15 = extraout_RDX_04;
      }
    }
    else {
      other = (TemplatedValidityMask<unsigned_long> *)(source + 0x28);
      duckdb::TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),other);
      local_a0 = (void *)(count + 0x3f >> 6);
      pvVar10 = (void *)0x0;
      iVar15 = extraout_RDX_00;
      uVar12 = 0;
      local_a8 = other;
      while (pvVar10 != local_a0) {
        local_98 = pvVar10;
        if (*(long *)other == 0) {
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
LAB_0011c976:
          for (; uVar7 = uVar12, uVar12 < uVar9; uVar12 = uVar12 + 1) {
            iVar1 = *(int *)(lVar4 + uVar12 * 4);
            duckdb::UnaryLambdaWrapper::
            Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                      (iVar1,(ValidityMask *)&local_b8,iVar15,pvVar10);
            *(int *)(lVar6 + uVar12 * 4) = iVar1;
            iVar15 = extraout_RDX_01;
          }
        }
        else {
          uVar5 = *(ulong *)(*(long *)other + (long)pvVar10 * 8);
          uVar9 = uVar12 + 0x40;
          if (count <= uVar12 + 0x40) {
            uVar9 = count;
          }
          if (uVar5 == 0xffffffffffffffff) goto LAB_0011c976;
          uVar7 = uVar9;
          if (uVar5 != 0) {
            local_88 = lVar6 + uVar12 * 4;
            local_90 = uVar12 * 4 + lVar4;
            for (uVar14 = 0; uVar7 = uVar12 + uVar14, other = local_a8, uVar12 + uVar14 < uVar9;
                uVar14 = uVar14 + 1) {
              if ((uVar5 >> (uVar14 & 0x3f) & 1) != 0) {
                iVar1 = *(int *)(local_90 + uVar14 * 4);
                duckdb::UnaryLambdaWrapper::
                Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                          (iVar1,(ValidityMask *)&local_b8,iVar15,pvVar10);
                *(int *)(local_88 + uVar14 * 4) = iVar1;
                iVar15 = extraout_RDX_02;
              }
            }
          }
        }
        uVar12 = uVar7;
        pvVar10 = (void *)((long)local_98 + 1);
      }
    }
  }
  else if (*source == (Vector)0x2) {
    duckdb::Vector::SetVectorType(VVar13);
    piVar2 = *(int **)(result + 0x20);
    piVar3 = *(int **)(source + 0x20);
    if ((*(byte **)(source + 0x28) == (byte *)0x0) || ((**(byte **)(source + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      iVar1 = *piVar3;
      duckdb::UnaryLambdaWrapper::
      Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                (iVar1,(ValidityMask *)&local_b8,idx,dataptr);
      *piVar2 = iVar1;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)source,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar13);
    lVar6 = *(long *)(result + 0x20);
    duckdb::FlatVector::VerifyFlatVector(result);
    if (local_68 == 0) {
      iVar15 = extraout_RDX_03;
      for (uVar12 = 0; count != uVar12; uVar12 = uVar12 + 1) {
        pvVar10 = (void *)*local_78;
        uVar9 = uVar12;
        if (pvVar10 != (void *)0x0) {
          uVar9 = (ulong)*(uint *)((long)pvVar10 + uVar12 * 4);
        }
        iVar1 = *(int *)(local_70 + uVar9 * 4);
        duckdb::UnaryLambdaWrapper::
        Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                  (iVar1,(ValidityMask *)&local_b8,iVar15,pvVar10);
        *(int *)(lVar6 + uVar12 * 4) = iVar1;
        iVar15 = extraout_RDX_05;
      }
    }
    else {
      for (iVar15 = 0; count != iVar15; iVar15 = iVar15 + 1) {
        iVar8 = iVar15;
        if (*local_78 != 0) {
          iVar8 = (idx_t)*(uint *)(*local_78 + iVar15 * 4);
        }
        pvVar10 = *(void **)(local_68 + (iVar8 >> 6) * 8);
        if (((ulong)pvVar10 >> (iVar8 & 0x3f) & 1) == 0) {
          duckdb::TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),iVar15);
        }
        else {
          iVar1 = *(int *)(local_70 + iVar8 * 4);
          duckdb::UnaryLambdaWrapper::
          Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
                    (iVar1,(ValidityMask *)&local_b8,iVar8 >> 6,pvVar10);
          *(int *)(lVar6 + iVar15 * 4) = iVar1;
        }
      }
    }
    duckdb::UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  }
  return true;
}

Assistant:

static bool IntToMinMaxCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &ty = result.GetType();
	auto min_val = MinMaxType::GetMinValue(ty);
	auto max_val = MinMaxType::GetMaxValue(ty);
	UnaryExecutor::Execute<int32_t, int32_t>(source, result, count, [&](int32_t input) {
		if (input < min_val || input > max_val) {
			throw ConversionException(StringUtil::Format("Value %s is outside of range [%s,%s]", to_string(input),
			                                             to_string(min_val), to_string(max_val)));
		}
		return input;
	});
	return true;
}